

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O3

ErrorCode __thiscall PDB::DBIStream::HasValidGlobalSymbolStream(DBIStream *this,RawFile *file)

{
  ErrorCode EVar1;
  ErrorCode EVar2;
  HashTableHeader data;
  DirectMSFStream globalStream;
  undefined1 local_48 [16];
  DirectMSFStream local_38;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>
            (&local_38,file,(uint)(this->m_header).globalStreamIndex);
  DirectMSFStream::ReadAtOffset(&local_38,local_48,0x10,0);
  EVar2 = UnknownVersion;
  if (SUB84(local_48._0_8_,4) == 0xf12f091a) {
    EVar2 = Success;
  }
  EVar1 = InvalidSignature;
  if ((uint32_t)local_48._0_8_ == 0xffffffff) {
    EVar1 = EVar2;
  }
  return EVar1;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::DBIStream::HasValidGlobalSymbolStream(const RawFile& file) const PDB_NO_EXCEPT
{
	DirectMSFStream globalStream = file.CreateMSFStream<DirectMSFStream>(m_header.globalStreamIndex);

	// the global symbol stream starts with a hash table header
	const HashTableHeader hashHeader = globalStream.ReadAtOffset<HashTableHeader>(0u);
	if (hashHeader.signature != HashTableHeader::Signature)
	{
		return ErrorCode::InvalidSignature;
	}
	else if (hashHeader.version != HashTableHeader::Version)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}